

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O3

void mc_wrench_add(mc_wrench *f1,mc_wrench *f2,mc_wrench *r,int count)

{
  if (f1 == (mc_wrench *)0x0) {
    __assert_fail("f1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x99,
                  "void mc_wrench_add(const struct mc_wrench *, const struct mc_wrench *, struct mc_wrench *, int)"
                 );
  }
  if (f2 != (mc_wrench *)0x0) {
    if (r != (mc_wrench *)0x0) {
      la_daxpy_oe(count * 3,1.0,(double *)f1->torque,1,(double *)f2->torque,1,(double *)r->torque,1)
      ;
      la_daxpy_oe(count * 3,1.0,(double *)f1->force,1,(double *)f2->force,1,(double *)r->force,1);
      return;
    }
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x9b,
                  "void mc_wrench_add(const struct mc_wrench *, const struct mc_wrench *, struct mc_wrench *, int)"
                 );
  }
  __assert_fail("f2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x9a,
                "void mc_wrench_add(const struct mc_wrench *, const struct mc_wrench *, struct mc_wrench *, int)"
               );
}

Assistant:

void mc_wrench_add(
        const struct mc_wrench *f1,
        const struct mc_wrench *f2,
        struct mc_wrench *r,
        int count)
{
    assert(f1);
    assert(f2);
    assert(r);

    la_daxpy_oe(3 * count,
            1.0, (double *)f1->torque, 1, (double *)f2->torque, 1,
            (double *)r->torque, 1);
    la_daxpy_oe(3 * count,
            1.0, (double *)f1->force, 1, (double *)f2->force, 1,
            (double *)r->force, 1);
}